

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall lest::not_expr(lest *this,text *message)

{
  string local_38 [32];
  text *local_18;
  text *message_local;
  
  local_18 = message;
  message_local = (text *)this;
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"! ( ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

inline text not_expr( text message )
{
    return "! ( " + message + " )";
}